

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall CImage::~CImage(CImage *this)

{
  CImage *this_local;
  
  Destroy(this);
  return;
}

Assistant:

DLL CImage::~CImage()
{
  Destroy();
}